

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<Tracepoint::Field>::relocate
          (QArrayDataPointer<Tracepoint::Field> *this,qsizetype offset,Field **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<Tracepoint::Field> *in_RDI;
  Field **unaff_retaddr;
  Field *res;
  Field *first;
  QArrayDataPointer<Tracepoint::Field> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<Tracepoint::Field,long_long>
            (first,(longlong)in_RDI,(Field *)0x120e24);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<Tracepoint::Field>,Tracepoint::Field_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x58 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }